

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> * __thiscall
hta::storage::file::Metric::get
          (vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *__return_storage_ptr__,
          Metric *this,TimePoint begin,TimePoint end,IntervalScope scope)

{
  type_conflict1 tVar1;
  type_conflict1 tVar2;
  RawFile *this_00;
  fpos<__mbstate_t> local_90 [2];
  allocator<hta::TimeValue> local_6a;
  undefined1 local_69;
  type_conflict1 *local_68;
  type_conflict1 *index_end;
  type_conflict1 *index_begin;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_50;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_48;
  pair<unsigned_long,_unsigned_long> local_40;
  Metric *local_30;
  Metric *this_local;
  IntervalScope scope_local;
  TimePoint end_local;
  TimePoint begin_local;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> *result;
  
  index_begin = (type_conflict1 *)scope;
  local_50.__d.__r =
       (duration)
       (duration)
       end.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
       __d.__r;
  local_48.__d.__r =
       (duration)
       (duration)
       begin.
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  local_30 = this;
  this_local = (Metric *)scope;
  scope_local = (IntervalScope)
                end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r;
  local_40 = find_index(this,begin,end,scope);
  index_end = std::get<0ul,unsigned_long,unsigned_long>(&local_40);
  local_68 = std::get<1ul,unsigned_long,unsigned_long>(&local_40);
  if (*index_end == *local_68) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::vector(__return_storage_ptr__);
  }
  else {
    local_69 = 0;
    tVar1 = *local_68;
    tVar2 = *index_end;
    std::allocator<hta::TimeValue>::allocator(&local_6a);
    std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>::vector
              (__return_storage_ptr__,tVar1 - tVar2,&local_6a);
    std::allocator<hta::TimeValue>::~allocator(&local_6a);
    this_00 = file_raw(this);
    std::fpos<__mbstate_t>::fpos(local_90,*index_end);
    File<hta::storage::file::Metric::Header,_hta::TimeValue>::read
              (this_00,(int)__return_storage_ptr__,(void *)local_90[0]._M_off,
               (size_t)local_90[0]._M_state);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TimeValue> Metric::get(TimePoint begin, TimePoint end, IntervalScope scope)
{
    auto [index_begin, index_end] = find_index(begin, end, scope);
    if (index_begin == index_end)
    {
        return {};
    }
    std::vector<TimeValue> result(index_end - index_begin);
    file_raw().read(result, index_begin);
    return result;
}